

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::EnumDescriptorProto::MergePartialFromCodedStream
          (EnumDescriptorProto *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  bool bVar6;
  uint uVar7;
  Limit LVar8;
  string *psVar9;
  EnumValueDescriptorProto *this_00;
  uint8 *puVar10;
  EnumOptions *pEVar11;
  uint32 tag;
  uint32 local_40;
  uint32 local_3c;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->value_).super_RepeatedPtrFieldBase;
LAB_001ebb33:
  while( true ) {
    puVar10 = input->buffer_;
    if ((puVar10 < input->buffer_end_) && (tag = (uint32)(char)*puVar10, -1 < (char)*puVar10)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar10 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar7 = tag >> 3;
    if (uVar7 != 3) break;
    if ((tag & 7) != 2) goto LAB_001ebc24;
LAB_001ebd5d:
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
    if (this->options_ == (EnumOptions *)0x0) {
      pEVar11 = (EnumOptions *)operator_new(0x68);
      EnumOptions::EnumOptions(pEVar11);
      this->options_ = pEVar11;
    }
    pEVar11 = this->options_;
    puVar10 = input->buffer_;
    if ((puVar10 < input->buffer_end_) && (uVar2 = *puVar10, -1 < (char)uVar2)) {
      input->buffer_ = puVar10 + 1;
      local_3c = (int)(char)uVar2;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_3c);
      if (!bVar6) {
        return false;
      }
    }
    iVar3 = input->recursion_depth_;
    input->recursion_depth_ = iVar3 + 1;
    if (input->recursion_limit_ <= iVar3) {
      return false;
    }
    LVar8 = io::CodedInputStream::PushLimit(input,local_3c);
    bVar6 = EnumOptions::MergePartialFromCodedStream(pEVar11,input);
    if (!bVar6) {
      return false;
    }
    if (input->legitimate_message_end_ != true) {
      return false;
    }
    io::CodedInputStream::PopLimit(input,LVar8);
    if (0 < input->recursion_depth_) {
      input->recursion_depth_ = input->recursion_depth_ + -1;
    }
    if ((input->buffer_ == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  }
  if (uVar7 == 2) {
    if ((tag & 7) == 2) goto LAB_001ebc4a;
  }
  else if ((uVar7 == 1) && ((tag & 7) == 2)) {
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar9 = (string *)operator_new(0x20);
      (psVar9->_M_dataplus)._M_p = (pointer)&psVar9->field_2;
      psVar9->_M_string_length = 0;
      (psVar9->field_2)._M_local_buf[0] = '\0';
      this->name_ = psVar9;
    }
    bVar6 = internal::WireFormatLite::ReadString(input,this->name_);
    if (!bVar6) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
    puVar10 = input->buffer_;
    if ((puVar10 < input->buffer_end_) && (*puVar10 == '\x12')) {
      do {
        input->buffer_ = puVar10 + 1;
LAB_001ebc4a:
        iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
        iVar4 = (this->value_).super_RepeatedPtrFieldBase.allocated_size_;
        if (iVar3 < iVar4) {
          ppvVar5 = (this->value_).super_RepeatedPtrFieldBase.elements_;
          (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          this_00 = (EnumValueDescriptorProto *)ppvVar5[iVar3];
        }
        else {
          iVar3 = (this->value_).super_RepeatedPtrFieldBase.total_size_;
          if (iVar4 == iVar3) {
            internal::RepeatedPtrFieldBase::Reserve(local_38,iVar3 + 1);
          }
          piVar1 = &(this->value_).super_RepeatedPtrFieldBase.allocated_size_;
          *piVar1 = *piVar1 + 1;
          this_00 = internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::New();
          ppvVar5 = (this->value_).super_RepeatedPtrFieldBase.elements_;
          iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
          (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          ppvVar5[iVar3] = this_00;
        }
        puVar10 = input->buffer_;
        if ((puVar10 < input->buffer_end_) && (uVar2 = *puVar10, -1 < (char)uVar2)) {
          input->buffer_ = puVar10 + 1;
          local_40 = (int)(char)uVar2;
        }
        else {
          bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_40);
          if (!bVar6) {
            return false;
          }
        }
        iVar3 = input->recursion_depth_;
        input->recursion_depth_ = iVar3 + 1;
        if (input->recursion_limit_ <= iVar3) {
          return false;
        }
        LVar8 = io::CodedInputStream::PushLimit(input,local_40);
        bVar6 = EnumValueDescriptorProto::MergePartialFromCodedStream(this_00,input);
        if (!bVar6) {
          return false;
        }
        if (input->legitimate_message_end_ != true) {
          return false;
        }
        io::CodedInputStream::PopLimit(input,LVar8);
        if (0 < input->recursion_depth_) {
          input->recursion_depth_ = input->recursion_depth_ + -1;
        }
        puVar10 = input->buffer_;
      } while ((puVar10 < input->buffer_end_) && (*puVar10 == '\x12'));
      puVar10 = input->buffer_;
      if ((puVar10 < input->buffer_end_) && (*puVar10 == '\x1a')) {
        input->buffer_ = puVar10 + 1;
        goto LAB_001ebd5d;
      }
    }
    goto LAB_001ebb33;
  }
LAB_001ebc24:
  if ((tag & 7) == 4) {
    return true;
  }
  bVar6 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
  if (!bVar6) {
    return false;
  }
  goto LAB_001ebb33;
}

Assistant:

bool EnumDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        break;
      }

      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}